

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

void __thiscall pbrt::ShapeSceneEntity::~ShapeSceneEntity(ShapeSceneEntity *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->outsideMedium)._M_dataplus._M_p;
  paVar2 = &(this->outsideMedium).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->insideMedium)._M_dataplus._M_p;
  paVar2 = &(this->insideMedium).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->materialName)._M_dataplus._M_p;
  paVar2 = &(this->materialName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&(this->super_SceneEntity).parameters.params);
  pcVar1 = (this->super_SceneEntity).name._M_dataplus._M_p;
  paVar2 = &(this->super_SceneEntity).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ShapeSceneEntity() = default;